

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

void rngRekey(void)

{
  size_t in_stack_00000008;
  octet *in_stack_00000010;
  octet *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000030;
  size_t in_stack_00000038;
  void *in_stack_00000040;
  
  mtMtxLock((mt_mtx_t *)0x1186cd);
  brngCTRStepR(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  brngCTRStart(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  memWipe(in_stack_00000010,in_stack_00000008);
  mtMtxUnlock((mt_mtx_t *)0x118721);
  return;
}

Assistant:

void rngRekey()
{
	// блокировать мьютекс
	ASSERT(_inited);
	mtMtxLock(_mtx);
	// сгенерировать новый ключ
	ASSERT(rngIsValid_internal());
	brngCTRStepR(_state->block, 32, _state->alg_state);
	// пересоздать brngCTR
	brngCTRStart(_state->alg_state, _state->block, 0);
	memWipe(_state->block, 32);
	// снять блокировку
	mtMtxUnlock(_mtx);
}